

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  long lVar1;
  secp256k1_fe *psVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_EAX;
  int extraout_EAX_00;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  char *extraout_RDX;
  size_t __n;
  ulong uVar9;
  secp256k1_ecdsa_signature *sig;
  secp256k1_gej *a;
  secp256k1_ge *r_00;
  ulong uVar10;
  secp256k1_context *ctx;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  secp256k1_gej *r_01;
  bool bVar14;
  undefined1 auVar15 [16];
  secp256k1_fe i;
  secp256k1_gej rj;
  secp256k1_ge p;
  uchar auStack_238 [72];
  secp256k1_gej *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  code *pcStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_fe *psStack_1b8;
  secp256k1_scalar *psStack_1b0;
  secp256k1_fe *local_1a0;
  undefined1 local_198 [104];
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  uint64_t local_118;
  int local_110;
  int local_10c;
  secp256k1_fe local_d8;
  int local_a8;
  secp256k1_ge local_98;
  
  r_01 = (secp256k1_gej *)local_198;
  psStack_1b0 = (secp256k1_scalar *)0x1220ad;
  secp256k1_fe_sqr((secp256k1_fe *)r_01,n);
  psStack_1b0 = (secp256k1_scalar *)0x1220bb;
  secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,n);
  local_1a0 = r;
  if (d == (secp256k1_fe *)0x0) {
    psStack_1b0 = (secp256k1_scalar *)0x1222b5;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    local_198._0_8_ = local_198._0_8_ + 7;
    local_198._40_4_ = local_198._40_4_ + 1;
    local_198._44_4_ = 0;
    psStack_1b0 = (secp256k1_scalar *)0x1222cb;
    secp256k1_fe_verify((secp256k1_fe *)local_198);
    if (known_on_curve == 0) {
      r_00 = (secp256k1_ge *)local_198;
LAB_001222d4:
      psStack_1b0 = (secp256k1_scalar *)0x1222d9;
      iVar5 = secp256k1_fe_is_square_var(&r_00->x);
      if (iVar5 == 0) {
        return 0;
      }
    }
LAB_001222e1:
    r = (secp256k1_fe *)local_198;
    psStack_1b0 = (secp256k1_scalar *)0x1222f9;
    secp256k1_fe_mul(&local_98.x,r,n);
    n = &local_98.y;
    psStack_1b0 = (secp256k1_scalar *)0x12230c;
    secp256k1_fe_sqr(n,r);
    local_98.infinity = 0;
    psStack_1b0 = (secp256k1_scalar *)0x12231d;
    a = (secp256k1_gej *)q;
    secp256k1_scalar_verify(q);
    auVar15._0_4_ = -(uint)((int)q->d[2] == 0 && (int)q->d[0] == 0);
    auVar15._4_4_ = -(uint)(*(int *)((long)q->d + 0x14) == 0 && *(int *)((long)q->d + 4) == 0);
    auVar15._8_4_ = -(uint)((int)q->d[3] == 0 && (int)q->d[1] == 0);
    auVar15._12_4_ = -(uint)(*(int *)((long)q->d + 0x1c) == 0 && *(int *)((long)q->d + 0xc) == 0);
    iVar5 = movmskps(extraout_EAX,auVar15);
    if (iVar5 == 0xf) {
      psStack_1b0 = (secp256k1_scalar *)0x1223e5;
      secp256k1_ecmult_const_xonly_cold_5();
    }
    else {
      r = (secp256k1_fe *)(local_198 + 0x60);
      psStack_1b0 = (secp256k1_scalar *)0x122358;
      secp256k1_ecmult_const((secp256k1_gej *)r,&local_98,q);
      psStack_1b0 = (secp256k1_scalar *)0x122360;
      a = (secp256k1_gej *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_a8 == 0) {
        psVar2 = (secp256k1_fe *)(local_198 + 0x30);
        psStack_1b0 = (secp256k1_scalar *)0x12237e;
        secp256k1_fe_sqr(psVar2,&local_d8);
        psStack_1b0 = (secp256k1_scalar *)0x12238e;
        secp256k1_fe_mul(psVar2,psVar2,(secp256k1_fe *)local_198);
        if (d != (secp256k1_fe *)0x0) {
          psStack_1b0 = (secp256k1_scalar *)0x1223a3;
          secp256k1_fe_mul((secp256k1_fe *)(local_198 + 0x30),(secp256k1_fe *)(local_198 + 0x30),d);
        }
        psVar2 = (secp256k1_fe *)(local_198 + 0x30);
        psStack_1b0 = (secp256k1_scalar *)0x1223b3;
        secp256k1_fe_inv(psVar2,psVar2);
        psStack_1b0 = (secp256k1_scalar *)0x1223c5;
        secp256k1_fe_mul(local_1a0,(secp256k1_fe *)(local_198 + 0x60),psVar2);
        return 1;
      }
    }
    psStack_1b0 = (secp256k1_scalar *)0x1223ea;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_001223ea:
    psStack_1b0 = (secp256k1_scalar *)0x1223ef;
    secp256k1_ecmult_const_xonly_cold_1();
  }
  else {
    psStack_1b0 = (secp256k1_scalar *)0x1220d1;
    secp256k1_fe_verify(d);
    uVar7 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar8 = (uVar7 >> 0x34) + d->n[1];
    uVar9 = (uVar8 >> 0x34) + d->n[2];
    a = (secp256k1_gej *)((uVar9 >> 0x34) + d->n[3]);
    uVar11 = ((ulong)a >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar8 | uVar7 | uVar9 | (ulong)a) & 0xfffffffffffff) == 0 && uVar11 == 0) ||
       (((uVar7 ^ 0x1000003d0) & uVar8 & uVar9 & (ulong)a & (uVar11 ^ 0xf000000000000)) ==
        0xfffffffffffff)) goto LAB_001223ea;
    r_01 = (secp256k1_gej *)(local_198 + 0x60);
    psStack_1b0 = (secp256k1_scalar *)0x12217d;
    secp256k1_fe_sqr((secp256k1_fe *)r_01,d);
    psStack_1b0 = (secp256k1_scalar *)0x122185;
    a = r_01;
    secp256k1_fe_verify((secp256k1_fe *)r_01);
    if (local_110 < 5) {
      local_110 = local_110 * 7;
      r_01 = (secp256k1_gej *)(local_198 + 0x60);
      local_198._96_8_ = local_198._96_8_ * 7;
      uStack_130 = uStack_130 * 7;
      local_128 = local_128 * 7;
      uStack_120 = uStack_120 * 7;
      local_118 = local_118 * 7;
      local_10c = 0;
      psStack_1b0 = (secp256k1_scalar *)0x122213;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      psStack_1b0 = (secp256k1_scalar *)0x122221;
      secp256k1_fe_mul((secp256k1_fe *)r_01,(secp256k1_fe *)r_01,d);
      r = (secp256k1_fe *)local_198;
      psStack_1b0 = (secp256k1_scalar *)0x12222e;
      secp256k1_fe_verify(r);
      psStack_1b0 = (secp256k1_scalar *)0x122236;
      a = r_01;
      secp256k1_fe_verify((secp256k1_fe *)r_01);
      if (0x20 < local_110 + local_198._40_4_) goto LAB_001223f4;
      local_198._0_8_ = local_198._0_8_ + local_198._96_8_;
      local_198._8_8_ = local_198._8_8_ + uStack_130;
      local_198._16_8_ = local_198._16_8_ + local_128;
      local_198._24_8_ = local_198._24_8_ + uStack_120;
      local_198._32_8_ = local_198._32_8_ + local_118;
      local_198._44_4_ = 0;
      psStack_1b0 = (secp256k1_scalar *)0x122287;
      local_198._40_4_ = local_110 + local_198._40_4_;
      secp256k1_fe_verify((secp256k1_fe *)local_198);
      if (known_on_curve == 0) {
        r_00 = &local_98;
        psStack_1b0 = (secp256k1_scalar *)0x1222a3;
        secp256k1_fe_mul(&r_00->x,(secp256k1_fe *)local_198,d);
        goto LAB_001222d4;
      }
      goto LAB_001222e1;
    }
  }
  psStack_1b0 = (secp256k1_scalar *)0x1223f4;
  secp256k1_ecmult_const_xonly_cold_3();
LAB_001223f4:
  psStack_1b0 = (secp256k1_scalar *)secp256k1_fe_normalize;
  secp256k1_ecmult_const_xonly_cold_2();
  pcStack_1c8 = (code *)0x12241a;
  psStack_1c0 = (secp256k1_gej *)r;
  psStack_1b8 = d;
  psStack_1b0 = q;
  secp256k1_fe_verify(&a->x);
  uVar7 = (a->x).n[4];
  uVar8 = (uVar7 >> 0x30) * 0x1000003d1 + (a->x).n[0];
  uVar11 = (uVar8 >> 0x34) + (a->x).n[1];
  uVar9 = (uVar11 >> 0x34) + (a->x).n[2];
  uVar10 = uVar9 & 0xfffffffffffff;
  uVar9 = (uVar9 >> 0x34) + (a->x).n[3];
  uVar7 = (uVar9 >> 0x34) + (uVar7 & 0xffffffffffff);
  uVar8 = uVar8 & 0xfffffffffffff;
  uVar12 = (ulong)(0xffffefffffc2e < uVar8 &&
                  ((uVar10 & uVar11 & uVar9) == 0xfffffffffffff && uVar7 == 0xffffffffffff)) |
           uVar7 >> 0x30;
  uVar8 = uVar12 * 0x1000003d1 + uVar8;
  uVar11 = (uVar8 >> 0x34) + (uVar11 & 0xfffffffffffff);
  sig = (secp256k1_ecdsa_signature *)((uVar11 >> 0x34) + uVar10);
  ctx = (secp256k1_context *)(((ulong)sig >> 0x34) + (uVar9 & 0xfffffffffffff));
  uVar7 = ((ulong)ctx >> 0x34) + uVar7;
  uVar9 = uVar7 >> 0x30;
  if ((uint)(ushort)(uVar7 >> 0x30) == (uint)uVar12) {
    (a->x).n[0] = uVar8 & 0xfffffffffffff;
    (a->x).n[1] = uVar11 & 0xfffffffffffff;
    (a->x).n[2] = (ulong)sig & 0xfffffffffffff;
    (a->x).n[3] = (ulong)ctx & 0xfffffffffffff;
    (a->x).n[4] = uVar7 & 0xffffffffffff;
    (a->x).magnitude = 1;
    (a->x).normalized = 1;
    secp256k1_fe_verify(&a->x);
    return extraout_EAX_00;
  }
  pcStack_1c8 = ecdsa_signature_parse_der_lax;
  secp256k1_fe_normalize_cold_1();
  uStack_1d0 = 0xfffffffffffff;
  uStack_1d8 = 0xffffffffffff;
  auStack_238[0x30] = '\0';
  auStack_238[0x31] = '\0';
  auStack_238[0x32] = '\0';
  auStack_238[0x33] = '\0';
  auStack_238[0x34] = '\0';
  auStack_238[0x35] = '\0';
  auStack_238[0x36] = '\0';
  auStack_238[0x37] = '\0';
  auStack_238[0x38] = '\0';
  auStack_238[0x39] = '\0';
  auStack_238[0x3a] = '\0';
  auStack_238[0x3b] = '\0';
  auStack_238[0x3c] = '\0';
  auStack_238[0x3d] = '\0';
  auStack_238[0x3e] = '\0';
  auStack_238[0x3f] = '\0';
  auStack_238[0x20] = '\0';
  auStack_238[0x21] = '\0';
  auStack_238[0x22] = '\0';
  auStack_238[0x23] = '\0';
  auStack_238[0x24] = '\0';
  auStack_238[0x25] = '\0';
  auStack_238[0x26] = '\0';
  auStack_238[0x27] = '\0';
  auStack_238[0x28] = '\0';
  auStack_238[0x29] = '\0';
  auStack_238[0x2a] = '\0';
  auStack_238[0x2b] = '\0';
  auStack_238[0x2c] = '\0';
  auStack_238[0x2d] = '\0';
  auStack_238[0x2e] = '\0';
  auStack_238[0x2f] = '\0';
  auStack_238[0x10] = '\0';
  auStack_238[0x11] = '\0';
  auStack_238[0x12] = '\0';
  auStack_238[0x13] = '\0';
  auStack_238[0x14] = '\0';
  auStack_238[0x15] = '\0';
  auStack_238[0x16] = '\0';
  auStack_238[0x17] = '\0';
  auStack_238[0x18] = '\0';
  auStack_238[0x19] = '\0';
  auStack_238[0x1a] = '\0';
  auStack_238[0x1b] = '\0';
  auStack_238[0x1c] = '\0';
  auStack_238[0x1d] = '\0';
  auStack_238[0x1e] = '\0';
  auStack_238[0x1f] = '\0';
  auStack_238[0] = '\0';
  auStack_238[1] = '\0';
  auStack_238[2] = '\0';
  auStack_238[3] = '\0';
  auStack_238[4] = '\0';
  auStack_238[5] = '\0';
  auStack_238[6] = '\0';
  auStack_238[7] = '\0';
  auStack_238[8] = '\0';
  auStack_238[9] = '\0';
  auStack_238[10] = '\0';
  auStack_238[0xb] = '\0';
  auStack_238[0xc] = '\0';
  auStack_238[0xd] = '\0';
  auStack_238[0xe] = '\0';
  auStack_238[0xf] = '\0';
  psStack_1f0 = a;
  psStack_1e8 = n;
  psStack_1e0 = r_01;
  pcStack_1c8 = (code *)(ulong)(uint)known_on_curve;
  secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_238);
  iVar5 = 0;
  iVar6 = 0;
  if (((uVar9 != 0) && (uVar9 != 1)) && (*extraout_RDX == '0')) {
    bVar3 = extraout_RDX[1];
    uVar7 = 2;
    if ((char)bVar3 < '\0') {
      if (uVar9 - 2 < (ulong)bVar3 - 0x80) {
        return 0;
      }
      uVar7 = (ulong)bVar3 - 0x7e;
    }
    iVar5 = iVar6;
    if (((uVar7 != uVar9) && (extraout_RDX[uVar7] == '\x02')) && (uVar7 + 1 != uVar9)) {
      uVar8 = uVar7 + 2;
      __n = (size_t)(byte)extraout_RDX[uVar7 + 1];
      if (extraout_RDX[uVar7 + 1] < '\0') {
        uVar11 = __n - 0x80;
        if (uVar9 - uVar8 < uVar11) {
          return 0;
        }
        if (uVar11 != 0) {
          do {
            if (extraout_RDX[uVar8] != '\0') goto LAB_00122680;
            uVar8 = uVar8 + 1;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
          uVar11 = 0;
          uVar8 = (uVar7 + __n) - 0x7e;
        }
LAB_00122680:
        if (7 < uVar11) {
          return 0;
        }
        if (uVar11 == 0) {
          __n = 0;
        }
        else {
          uVar7 = 0;
          __n = 0;
          do {
            __n = (ulong)(byte)extraout_RDX[uVar7 + uVar8] | __n << 8;
            uVar7 = uVar7 + 1;
          } while (uVar11 != uVar7);
          uVar8 = uVar8 + uVar11;
        }
      }
      if (((__n <= uVar9 - uVar8) && (uVar7 = uVar8 + __n, uVar7 != uVar9)) &&
         ((extraout_RDX[uVar7] == '\x02' && (uVar7 + 1 != uVar9)))) {
        lVar13 = uVar7 + 2;
        uVar11 = (ulong)(byte)extraout_RDX[uVar7 + 1];
        if (extraout_RDX[uVar7 + 1] < '\0') {
          uVar10 = uVar11 - 0x80;
          if (uVar9 - lVar13 < uVar10) {
            return 0;
          }
          if (uVar10 != 0) {
            do {
              if (extraout_RDX[lVar13] != '\0') goto LAB_001227df;
              lVar13 = lVar13 + 1;
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            uVar10 = 0;
            lVar13 = uVar8 + __n + uVar11 + -0x7e;
          }
LAB_001227df:
          if (7 < uVar10) {
            return 0;
          }
          if (uVar10 == 0) {
            uVar11 = 0;
          }
          else {
            uVar12 = 0;
            uVar11 = 0;
            do {
              uVar11 = (ulong)(byte)extraout_RDX[uVar12 + lVar13] | uVar11 << 8;
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            lVar13 = lVar13 + uVar10;
          }
        }
        if (uVar11 <= uVar9 - lVar13) {
          if (__n != 0) {
            do {
              if (extraout_RDX[uVar8] != '\0') goto LAB_0012270a;
              uVar8 = uVar8 + 1;
              __n = __n - 1;
            } while (__n != 0);
            __n = 0;
            uVar8 = uVar7;
          }
LAB_0012270a:
          bVar14 = 0xffffffffffffffdf < __n - 0x21;
          if (bVar14) {
            memcpy(auStack_238 + (0x20 - __n),extraout_RDX + uVar8,__n);
          }
          bVar14 = !bVar14 && 0x20 < __n;
          if (uVar11 != 0) {
            lVar1 = lVar13 + uVar11;
            do {
              if (extraout_RDX[lVar13] != '\0') goto LAB_0012275d;
              lVar13 = lVar13 + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
            uVar11 = 0;
            lVar13 = lVar1;
          }
LAB_0012275d:
          bVar4 = 0x20 < uVar11 || bVar14;
          if (0xffffffffffffffdf < uVar11 - 0x21) {
            memcpy(auStack_238 + (0x40 - uVar11),extraout_RDX + lVar13,uVar11);
            bVar4 = bVar14;
          }
          if ((!bVar4) &&
             (iVar5 = secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_238), iVar5 != 0)) {
            return 1;
          }
          auStack_238[0x30] = '\0';
          auStack_238[0x31] = '\0';
          auStack_238[0x32] = '\0';
          auStack_238[0x33] = '\0';
          auStack_238[0x34] = '\0';
          auStack_238[0x35] = '\0';
          auStack_238[0x36] = '\0';
          auStack_238[0x37] = '\0';
          auStack_238[0x38] = '\0';
          auStack_238[0x39] = '\0';
          auStack_238[0x3a] = '\0';
          auStack_238[0x3b] = '\0';
          auStack_238[0x3c] = '\0';
          auStack_238[0x3d] = '\0';
          auStack_238[0x3e] = '\0';
          auStack_238[0x3f] = '\0';
          auStack_238[0x20] = '\0';
          auStack_238[0x21] = '\0';
          auStack_238[0x22] = '\0';
          auStack_238[0x23] = '\0';
          auStack_238[0x24] = '\0';
          auStack_238[0x25] = '\0';
          auStack_238[0x26] = '\0';
          auStack_238[0x27] = '\0';
          auStack_238[0x28] = '\0';
          auStack_238[0x29] = '\0';
          auStack_238[0x2a] = '\0';
          auStack_238[0x2b] = '\0';
          auStack_238[0x2c] = '\0';
          auStack_238[0x2d] = '\0';
          auStack_238[0x2e] = '\0';
          auStack_238[0x2f] = '\0';
          auStack_238[0x10] = '\0';
          auStack_238[0x11] = '\0';
          auStack_238[0x12] = '\0';
          auStack_238[0x13] = '\0';
          auStack_238[0x14] = '\0';
          auStack_238[0x15] = '\0';
          auStack_238[0x16] = '\0';
          auStack_238[0x17] = '\0';
          auStack_238[0x18] = '\0';
          auStack_238[0x19] = '\0';
          auStack_238[0x1a] = '\0';
          auStack_238[0x1b] = '\0';
          auStack_238[0x1c] = '\0';
          auStack_238[0x1d] = '\0';
          auStack_238[0x1e] = '\0';
          auStack_238[0x1f] = '\0';
          auStack_238[0] = '\0';
          auStack_238[1] = '\0';
          auStack_238[2] = '\0';
          auStack_238[3] = '\0';
          auStack_238[4] = '\0';
          auStack_238[5] = '\0';
          auStack_238[6] = '\0';
          auStack_238[7] = '\0';
          auStack_238[8] = '\0';
          auStack_238[9] = '\0';
          auStack_238[10] = '\0';
          auStack_238[0xb] = '\0';
          auStack_238[0xc] = '\0';
          auStack_238[0xd] = '\0';
          auStack_238[0xe] = '\0';
          auStack_238[0xf] = '\0';
          secp256k1_ecdsa_signature_parse_compact(ctx,sig,auStack_238);
          iVar5 = 1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
    secp256k1_ecmult_const(&rj, &p, q);
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}